

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-common.cpp
# Opt level: O0

ggml_opt_result_t mnist_model_eval(mnist_model *model,ggml_opt_dataset_t dataset)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 in_RSI;
  long in_RDI;
  int nex;
  double t_total_ms;
  int64_t t_total_us;
  int64_t t_start_us;
  ggml_opt_context_t opt_ctx;
  ggml_opt_params params;
  ggml_opt_result_t result;
  undefined1 local_a0 [8];
  undefined4 uStack_98;
  undefined4 local_90;
  undefined4 uStack_88;
  undefined4 local_80;
  undefined4 uStack_78;
  undefined4 local_70;
  undefined4 uStack_68;
  undefined8 local_60;
  undefined1 local_58 [36];
  undefined4 local_34;
  ggml_opt_result_t local_18;
  undefined8 local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = (ggml_opt_result_t)ggml_opt_result_init();
  ggml_opt_default_params
            (local_58,*(undefined8 *)(local_8 + 0x20),*(undefined8 *)(local_8 + 0xb8),
             *(undefined8 *)(local_8 + 0x48),*(undefined8 *)(local_8 + 0x50),2);
  local_34 = 0;
  memcpy(local_a0,local_58,0x40);
  local_60 = ggml_opt_init();
  lVar1 = ggml_time_us();
  ggml_opt_epoch(local_60,local_10,0,local_18,0,0,0,uStack_98,local_90,uStack_88,local_80,uStack_78,
                 local_70,uStack_68);
  lVar2 = ggml_time_us();
  lVar3 = ggml_opt_dataset_data(local_10);
  fprintf(_stderr,"%s: model evaluation on %d images took %.2lf ms, %.2lf us/image\n",
          SUB84((double)(lVar2 - lVar1) * 0.001,0),
          SUB84((double)(lVar2 - lVar1) / (double)(int)*(ulong *)(lVar3 + 0x18),0),
          "mnist_model_eval",*(ulong *)(lVar3 + 0x18) & 0xffffffff);
  ggml_opt_free(local_60);
  return local_18;
}

Assistant:

ggml_opt_result_t mnist_model_eval(mnist_model & model, ggml_opt_dataset_t dataset) {
    ggml_opt_result_t result = ggml_opt_result_init();

    ggml_opt_params params = ggml_opt_default_params(model.backend_sched, model.ctx_compute, model.images, model.logits, GGML_OPT_LOSS_TYPE_CROSS_ENTROPY);
    params.build_type = GGML_OPT_BUILD_TYPE_FORWARD;
    ggml_opt_context_t opt_ctx = ggml_opt_init(params);

    {
        const int64_t t_start_us = ggml_time_us();

        ggml_opt_epoch(opt_ctx, dataset, nullptr, result, /*idata_split =*/ 0, nullptr, nullptr);

        const int64_t t_total_us = ggml_time_us() - t_start_us;
        const double t_total_ms = 1e-3*t_total_us;
        const int nex = ggml_opt_dataset_data(dataset)->ne[1];
        fprintf(stderr, "%s: model evaluation on %d images took %.2lf ms, %.2lf us/image\n",
                __func__, nex, t_total_ms, (double) t_total_us/nex);
    }

    ggml_opt_free(opt_ctx);

    return result;
}